

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O2

XMLSize_t __thiscall
xercesc_4_0::DTDGrammar::getElemId
          (DTDGrammar *this,uint param_1,XMLCh *param_2,XMLCh *qName,uint param_4)

{
  DTDElementDecl *pDVar1;
  XMLSize_t XVar2;
  
  pDVar1 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this->fElemDeclPool,qName);
  if (pDVar1 == (DTDElementDecl *)0x0) {
    XVar2 = 0xfffffffe;
  }
  else {
    XVar2 = (pDVar1->super_XMLElementDecl).fId;
  }
  return XVar2;
}

Assistant:

inline XMLSize_t DTDGrammar::getElemId (const   unsigned int
                                              , const XMLCh* const
                                              , const XMLCh* const    qName
                                              , unsigned int) const
{
    //
    //  In this case, we don't return zero to mean 'not found', so we have to
    //  map it to the official not found value if we don't find it.
    //
    const DTDElementDecl* decl = fElemDeclPool->getByKey(qName);
    if (!decl)
        return XMLElementDecl::fgInvalidElemId;
    return decl->getId();
}